

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O2

size_t poplar::get_process_size(void)

{
  long lVar1;
  int iVar2;
  FILE *__stream;
  size_t vm;
  size_t dummy;
  long local_20 [2];
  
  __stream = fopen("/proc/self/statm","r");
  local_20[1] = 0;
  local_20[0] = 0;
  __isoc99_fscanf(__stream,"%ld %ld ",local_20 + 1,local_20);
  fclose(__stream);
  lVar1 = local_20[0];
  iVar2 = getpagesize();
  return iVar2 * lVar1;
}

Assistant:

inline size_t get_process_size() {
#ifdef __APPLE__
    struct task_basic_info t_info;
    mach_msg_type_number_t t_info_count = TASK_BASIC_INFO_COUNT;
    task_info(current_task(), TASK_BASIC_INFO, reinterpret_cast<task_info_t>(&t_info), &t_info_count);
    return t_info.resident_size;
#else
    FILE* fp = std::fopen("/proc/self/statm", "r");
    size_t dummy(0), vm(0);
    std::fscanf(fp, "%ld %ld ", &dummy, &vm);  // get resident (see procfs)
    std::fclose(fp);
    return vm * ::getpagesize();
#endif
}